

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FieldDescriptor *field)

{
  float value;
  double value_00;
  CppType CVar1;
  EnumDescriptor *this_00;
  EnumValueDescriptor *pEVar2;
  LogMessage *other;
  long lVar3;
  undefined1 qualified;
  int number;
  FieldDescriptor *field_00;
  cpp *this_01;
  char *__s;
  SubstituteArg *this_02;
  SubstituteArg local_210;
  string local_1e0;
  undefined1 local_1c0 [32];
  SubstituteArg local_1a0;
  SubstituteArg local_170;
  SubstituteArg local_140;
  SubstituteArg local_110;
  SubstituteArg local_e0;
  SubstituteArg local_b0;
  SubstituteArg local_80;
  SubstituteArg local_50;
  
  this_02 = (SubstituteArg *)&stack0xfffffffffffffdb8;
  this_01 = this;
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
  qualified = 0x50;
  switch(CVar1) {
  case CPPTYPE_INT32:
    Int32ToString_abi_cxx11_
              (__return_storage_ptr__,(cpp *)(ulong)*(uint *)(this + 0xa0),(uint)field_00);
    return __return_storage_ptr__;
  case CPPTYPE_INT64:
    Int64ToString_abi_cxx11_(__return_storage_ptr__,*(cpp **)(this + 0xa0),(int64)field_00);
    return __return_storage_ptr__;
  case CPPTYPE_UINT32:
    SimpleItoa_abi_cxx11_
              ((string *)&stack0xfffffffffffffdb8,(protobuf *)(ulong)*(uint *)(this + 0xa0),
               (uint)field_00);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffdb8,"u");
    break;
  case CPPTYPE_UINT64:
    SimpleItoa_abi_cxx11_((string *)&local_210,*(protobuf **)(this + 0xa0),(unsigned_long)field_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffdb8,"GOOGLE_ULONGLONG(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_210);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffdb8,")");
    goto LAB_002476a3;
  case CPPTYPE_DOUBLE:
    value_00 = *(double *)(this + 0xa0);
    if (value_00 < INFINITY) {
      if (-INFINITY < value_00) {
        if (!NAN(value_00)) {
          SimpleDtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)this_01,value_00);
          return __return_storage_ptr__;
        }
        __s = "::google::protobuf::internal::NaN()";
      }
      else {
        __s = "-::google::protobuf::internal::Infinity()";
      }
    }
    else {
      __s = "::google::protobuf::internal::Infinity()";
    }
    goto LAB_00247860;
  case CPPTYPE_FLOAT:
    value = *(float *)(this + 0xa0);
    if (value < INFINITY) {
      if (-INFINITY < value) {
        if (!NAN(value)) {
          SimpleFtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)this_01,value);
          lVar3 = std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0x344d3a);
          if (lVar3 == -1) {
            return __return_storage_ptr__;
          }
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        __s = "static_cast<float>(::google::protobuf::internal::NaN())";
      }
      else {
        __s = "static_cast<float>(-::google::protobuf::internal::Infinity())";
      }
    }
    else {
      __s = "static_cast<float>(::google::protobuf::internal::Infinity())";
    }
    goto LAB_00247860;
  case CPPTYPE_BOOL:
    __s = "false";
    if (this[0xa0] != (cpp)0x0) {
      __s = "true";
    }
    goto LAB_00247860;
  case CPPTYPE_ENUM:
    this_00 = FieldDescriptor::enum_type((FieldDescriptor *)this);
    ClassName_abi_cxx11_((string *)local_1c0,(cpp *)this_00,(EnumDescriptor *)0x1,(bool)qualified);
    pEVar2 = FieldDescriptor::default_value_enum((FieldDescriptor *)this);
    Int32ToString_abi_cxx11_(&local_1e0,(cpp *)(ulong)*(uint *)(pEVar2 + 0x10),number);
    local_1a0.text_ = (char *)0x0;
    local_1a0.size_ = -1;
    local_50.text_ = (char *)0x0;
    local_50.size_ = -1;
    local_80.text_ = (char *)0x0;
    local_80.size_ = -1;
    local_b0.text_ = (char *)0x0;
    local_b0.size_ = -1;
    local_e0.text_ = (char *)0x0;
    local_e0.size_ = -1;
    local_110.text_ = (char *)0x0;
    local_210.text_ = local_1e0._M_dataplus._M_p;
    local_110.size_ = -1;
    local_140.text_ = (char *)0x0;
    local_140.size_ = -1;
    local_170.text_ = (char *)0x0;
    local_210.size_ = (int)local_1e0._M_string_length;
    local_170.size_ = -1;
    strings::Substitute_abi_cxx11_
              (__return_storage_ptr__,(strings *)"static_cast< $0 >($1)",&stack0xfffffffffffffdb8,
               &local_210,&local_1a0,&local_50,&local_80,&local_b0,&local_e0,&local_110,&local_140,
               &local_170,(SubstituteArg *)local_1c0._0_8_);
    std::__cxx11::string::~string((string *)&local_1e0);
    this_02 = (SubstituteArg *)local_1c0;
    break;
  case CPPTYPE_STRING:
    CEscape((string *)&local_1a0,*(string **)(this + 0xa0));
    EscapeTrigraphs((string *)&local_210,(string *)&local_1a0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffdb8,"\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_210);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffdb8,"\"");
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb8);
    std::__cxx11::string::~string((string *)&local_210);
    this_02 = &local_1a0;
    break;
  case CPPTYPE_MESSAGE:
    FieldMessageTypeName_abi_cxx11_((string *)&local_210,this,field_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffdb8,"*",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_210);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffdb8,"::internal_default_instance()");
LAB_002476a3:
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb8);
    this_02 = &local_210;
    break;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)&stack0xfffffffffffffdb8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
               ,0x1a8);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&stack0xfffffffffffffdb8,"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)&local_210,other);
    internal::LogMessage::~LogMessage((LogMessage *)&stack0xfffffffffffffdb8);
    __s = "";
LAB_00247860:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&stack0xfffffffffffffdb8);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)this_02);
  return __return_storage_ptr__;
}

Assistant:

string DefaultValue(const FieldDescriptor* field) {
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return Int32ToString(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      return SimpleItoa(field->default_value_uint32()) + "u";
    case FieldDescriptor::CPPTYPE_INT64:
      return Int64ToString(field->default_value_int64());
    case FieldDescriptor::CPPTYPE_UINT64:
      return "GOOGLE_ULONGLONG(" + SimpleItoa(field->default_value_uint64())+ ")";
    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value = field->default_value_double();
      if (value == std::numeric_limits<double>::infinity()) {
        return "::google::protobuf::internal::Infinity()";
      } else if (value == -std::numeric_limits<double>::infinity()) {
        return "-::google::protobuf::internal::Infinity()";
      } else if (value != value) {
        return "::google::protobuf::internal::NaN()";
      } else {
        return SimpleDtoa(value);
      }
    }
    case FieldDescriptor::CPPTYPE_FLOAT:
      {
        float value = field->default_value_float();
        if (value == std::numeric_limits<float>::infinity()) {
          return "static_cast<float>(::google::protobuf::internal::Infinity())";
        } else if (value == -std::numeric_limits<float>::infinity()) {
          return "static_cast<float>(-::google::protobuf::internal::Infinity())";
        } else if (value != value) {
          return "static_cast<float>(::google::protobuf::internal::NaN())";
        } else {
          string float_value = SimpleFtoa(value);
          // If floating point value contains a period (.) or an exponent
          // (either E or e), then append suffix 'f' to make it a float
          // literal.
          if (float_value.find_first_of(".eE") != string::npos) {
            float_value.push_back('f');
          }
          return float_value;
        }
      }
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_ENUM:
      // Lazy:  Generate a static_cast because we don't have a helper function
      //   that constructs the full name of an enum value.
      return strings::Substitute(
          "static_cast< $0 >($1)",
          ClassName(field->enum_type(), true),
          Int32ToString(field->default_value_enum()->number()));
    case FieldDescriptor::CPPTYPE_STRING:
      return "\"" + EscapeTrigraphs(
        CEscape(field->default_value_string())) +
        "\"";
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "*" + FieldMessageTypeName(field) +
             "::internal_default_instance()";
  }
  // Can't actually get here; make compiler happy.  (We could add a default
  // case above but then we wouldn't get the nice compiler warning when a
  // new type is added.)
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}